

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscContext.cpp
# Opt level: O1

bool __thiscall CNscContext::ParsePragmaNscIntrinsics(CNscContext *this,char *pszPragma)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  
  cVar1 = *pszPragma;
  if (cVar1 != '\0') {
    pcVar2 = pszPragma + 1;
    do {
      if (0xa1 < (byte)(cVar1 + 0x81U)) {
        GenerateMessage(this,NscMessage_ErrorPreprocessorSyntax,"#pragma");
        return false;
      }
      cVar1 = *pcVar2;
      pcVar2 = pcVar2 + 1;
    } while (cVar1 != '\0');
  }
  bVar3 = this->m_fNWScript == false;
  if (bVar3) {
    GenerateMessage(this,NscMessage_ErrorNscIntrinsicsIsInternalOnly);
  }
  else {
    this->m_fCompilingIntrinsic = true;
  }
  return !bVar3;
}

Assistant:

bool CNscContext::ParsePragmaNscIntrinsics (const char *pszPragma)
{
	const char *p = pszPragma;

	//
	// Make sure there isn't anything at the end
	//

	while (*p && (*p <= ' ' || *p > 126))
		p++;
	if (*p != 0)
	{
		GenerateMessage (NscMessage_ErrorPreprocessorSyntax, "#pragma");
		return false;
	}

	if (IsNWScript () == false)
	{
		GenerateMessage (NscMessage_ErrorNscIntrinsicsIsInternalOnly);
		return false;
	}

	SetCompilingIntrinsic (true);
	return true;
}